

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int ffgthd(char *tmplt,char *card,int *hdtype,int *status)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  size_t sVar7;
  char *pcVar8;
  char *pcVar9;
  int tstatus;
  char *suffix;
  char keyname [75];
  char value [140];
  char tvalue [140];
  char comment [140];
  int local_244;
  byte *local_240;
  uint local_238;
  undefined4 uStack_234;
  char local_230;
  undefined2 local_1e8;
  char local_1df [135];
  char local_158 [144];
  char local_c8 [152];
  
  if (0 < *status) {
    return *status;
  }
  *card = '\0';
  *hdtype = 0;
  if ((*tmplt == ' ') && (iVar3 = strncmp(tmplt,"        ",8), iVar3 == 0)) {
    strncat(card,tmplt,0x50);
    *hdtype = 1;
    goto LAB_00138abf;
  }
  local_238 = local_238 & 0xffffff00;
  local_1e8 = (ushort)local_1e8._1_1_ << 8;
  local_c8[0] = '\0';
  sVar5 = strspn(tmplt," ");
  pcVar8 = tmplt + (int)sVar5;
  iVar3 = strncmp(pcVar8,"--------------------",0x14);
  if (iVar3 == 0) goto LAB_00138781;
  if (*pcVar8 == '-') {
    *hdtype = -1;
    sVar5 = strspn(pcVar8 + 1," ");
    pcVar8 = pcVar8 + (long)(int)sVar5 + 1;
    sVar5 = strcspn(pcVar8," =+");
    iVar3 = (int)sVar5;
    if (iVar3 < 0x4b) {
      sVar5 = (size_t)iVar3;
      strncat(card,pcVar8,sVar5);
      if (iVar3 < 9) {
        ffupch(card);
        local_244 = 0;
        iVar4 = fftkey(card,&local_244);
        if (0 < iVar4) {
          *card = '\0';
          strncat(card,pcVar8,sVar5);
        }
      }
      if (pcVar8[sVar5] == '+') {
        sVar5 = strlen(card);
        (card + sVar5)[0] = '+';
        (card + sVar5)[1] = '\0';
      }
      else {
        pcVar8 = pcVar8 + sVar5;
        sVar5 = strspn(pcVar8," ");
        if ((pcVar8[(int)sVar5] != '=') && (pcVar8[(int)sVar5] != '\0')) {
          pcVar8 = pcVar8 + (int)sVar5;
          *hdtype = -2;
          sVar5 = strcspn(pcVar8," ");
          if ((0x28 < iVar3) || (iVar3 = (int)sVar5, 0x28 < iVar3)) {
            *card = '\0';
            goto LAB_00138781;
          }
          sVar5 = strlen(card);
          builtin_strncpy(card + sVar5,"                                        ",0x29);
          pcVar9 = card + 0x28;
          strncpy(pcVar9,pcVar8,(long)iVar3);
          card[0x50] = '\0';
          if (iVar3 < 9) {
            ffupch(pcVar9);
            local_244 = 0;
            iVar4 = fftkey(pcVar9,&local_244);
            if (0 < iVar4) {
              strncpy(pcVar9,pcVar8,(long)iVar3);
            }
          }
        }
      }
      goto LAB_00138abf;
    }
    goto LAB_00138781;
  }
  sVar5 = strcspn(pcVar8," =");
  iVar3 = (int)sVar5;
  if (0x4a < iVar3) goto LAB_00138781;
  sVar5 = (size_t)iVar3;
  strncat((char *)&local_238,pcVar8,sVar5);
  if (iVar3 < 9) {
    ffupch((char *)&local_238);
    local_244 = 0;
    iVar3 = fftkey((char *)&local_238,&local_244);
    if (0 < iVar3) {
      local_238 = local_238 & 0xffffff00;
      strncat((char *)&local_238,pcVar8,sVar5);
    }
  }
  if (((char)local_238 == 'E') && (local_238 == 0x444e45)) {
    builtin_strncpy(card,"END",4);
    *hdtype = 2;
    goto LAB_00138abf;
  }
  pcVar8 = pcVar8 + sVar5;
  if (((((char)local_238 == 'C') && (CONCAT44(uStack_234,local_238) == 0x544e454d4d4f43)) ||
      (((char)local_238 == 'H' && (CONCAT44(uStack_234,local_238) == 0x59524f54534948)))) ||
     (((char)local_238 == 'H' &&
      (local_230 == '\0' && CONCAT44(uStack_234,local_238) == 0x4843524152454948)))) {
    *hdtype = 1;
    strcpy(card,(char *)&local_238);
    strncat(card,pcVar8,0x48);
    goto LAB_00138abf;
  }
  sVar5 = strspn(pcVar8," =");
  pcVar9 = pcVar8 + (int)sVar5;
  cVar2 = pcVar8[(int)sVar5];
  if ((cVar2 == '\0') || (cVar2 == '/')) {
    sVar5 = strlen((char *)&local_1e8);
    *(undefined2 *)((long)&local_1e8 + sVar5) = 0x20;
  }
  else if (cVar2 == '\'') {
    pcVar8 = pcVar9;
    iVar3 = 0x8b;
    do {
      sVar5 = strcspn(pcVar8 + 1,"\'");
      iVar4 = (int)sVar5 + 2;
      if (iVar3 < iVar4) goto LAB_00138781;
      strncat((char *)&local_1e8,pcVar8,(long)iVar4);
      lVar6 = (long)((sVar5 << 0x20) + 0x100000000) >> 0x20;
      if (pcVar8[lVar6] != '\'') {
        *status = 0xcd;
        return 0xcd;
      }
      pcVar9 = pcVar8 + lVar6 + 1;
      pcVar1 = pcVar8 + lVar6 + 1;
      pcVar8 = pcVar9;
      iVar3 = iVar3 - iVar4;
    } while (*pcVar1 == '\'');
  }
  else {
    sVar5 = strcspn(pcVar9," /");
    iVar3 = (int)sVar5;
    if (0x8b < iVar3) goto LAB_00138781;
    sVar5 = (size_t)iVar3;
    strncat((char *)&local_1e8,pcVar9,sVar5);
    if ((((cVar2 != 'T') && (cVar2 != 'F')) || (0x2f < (ulong)(byte)pcVar9[1])) ||
       ((0x800100000001U >> ((ulong)(byte)pcVar9[1] & 0x3f) & 1) == 0)) {
      strtod((char *)&local_1e8,(char **)&local_240);
      if ((0x2f < (ulong)*local_240) || ((0x800100000001U >> ((ulong)*local_240 & 0x3f) & 1) == 0))
      {
        strcpy(local_158,(char *)&local_1e8);
        pcVar8 = strchr(local_158,0x44);
        if ((pcVar8 == (char *)0x0) && (pcVar8 = strchr(local_158,100), pcVar8 == (char *)0x0)) {
          pcVar8 = strchr(local_158,0x2e);
          if (pcVar8 == (char *)0x0) goto LAB_00138bbe;
          *pcVar8 = ',';
        }
        else {
          *pcVar8 = 'E';
        }
        strtod(local_158,(char **)&local_240);
      }
LAB_00138bbe:
      if (((ulong)*local_240 < 0x30) && ((0x800100000001U >> ((ulong)*local_240 & 0x3f) & 1) != 0))
      {
        pcVar8 = strchr((char *)&local_1e8,0x65);
        if (pcVar8 == (char *)0x0) {
          pcVar8 = strchr((char *)&local_1e8,100);
          if (pcVar8 != (char *)0x0) {
            *pcVar8 = 'D';
          }
        }
        else {
          *pcVar8 = 'E';
        }
      }
      else {
        if (0x89 < iVar3) {
LAB_00138781:
          *status = 0xcf;
          return 0xcf;
        }
        local_1e8 = 0x27;
        strncat((char *)&local_1e8,pcVar9,sVar5);
        sVar7 = strlen((char *)&local_1e8);
        *(undefined2 *)((long)&local_1e8 + sVar7) = 0x27;
      }
    }
    pcVar9 = pcVar9 + sVar5;
  }
  sVar5 = strspn(pcVar9," /");
  sVar7 = strlen((char *)&local_1e8);
  iVar3 = (int)sVar7;
  if ((iVar3 - 1U < 9) && ((char)local_1e8 == '\'')) {
    *(undefined1 *)((long)&local_1e8 + (ulong)(iVar3 - 1)) = 0;
    strncat((char *)&local_1e8,"        ",(ulong)(10 - iVar3));
    sVar7 = strlen(local_1df);
    (local_1df + sVar7)[0] = '\'';
    (local_1df + sVar7)[1] = '\0';
  }
  strncat(local_c8,pcVar9 + (int)sVar5,0x46);
  ffmkky((char *)&local_238,(char *)&local_1e8,local_c8,card,status);
LAB_00138abf:
  return *status;
}

Assistant:

int ffgthd(char *tmplt, /* I - input header template string */
           char *card,  /* O - returned FITS header record */
           int *hdtype, /* O - how to interpreter the returned card string */ 
            /*
              -2 = modify the name of a keyword; the old keyword name
                   is returned starting at address chars[0]; the new name
                   is returned starting at address char[40] (to be consistent
                   with the Fortran version).  Both names are null terminated. 
              -1 = card contains the name of a keyword that is to be deleted
               0 = append this keyword if it doesn't already exist, or 
                   modify the value if the keyword already exists.
               1 = append this comment keyword ('HISTORY', 
                   'COMMENT', or blank keyword name) 
               2  =  this is the END keyword; do not write it to the header
            */
           int *status)   /* IO - error status   */
/*
  'Get Template HeaDer'
  parse a template header line and create a formated
  character string which is suitable for appending to a FITS header 
*/
{
    char keyname[FLEN_KEYWORD], value[140], comment[140];
    char *tok, *suffix, *loc, tvalue[140];
    int len, vlen, more, tstatus, lentok1=0, remainlen=0;
    double dval;

    if (*status > 0)
        return(*status);

    card[0]   = '\0';
    *hdtype   = 0;

    if (!FSTRNCMP(tmplt, "        ", 8) )
    {
        /* if first 8 chars of template are blank, then this is a comment */
        strncat(card, tmplt, 80);
        *hdtype = 1;
        return(*status);
    }

    tok = tmplt;   /* point to start of template string */
 
    keyname[0] = '\0';
    value[0]   = '\0';
    comment[0] = '\0';

    len = strspn(tok, " ");  /* no. of spaces before keyword */
    tok += len;

    /* test for pecular case where token is a string of dashes */
    if (strncmp(tok, "--------------------", 20) == 0)
            return(*status = BAD_KEYCHAR);

    if (tok[0] == '-')  /* is there a leading minus sign? */
    {
        /* first token is name of keyword to be deleted or renamed */
        *hdtype = -1;
        tok++;
        len = strspn(tok, " ");  /* no. of spaces before keyword */
        tok += len;
        
        len = strcspn(tok, " =+");  /* length of name */
        if (len >= FLEN_KEYWORD)
          return(*status = BAD_KEYCHAR);

        lentok1 = len;
        strncat(card, tok, len);

        /*
          The HIERARCH convention supports non-standard characters
          in the keyword name, so don't always convert to upper case or
          abort if there are illegal characters in the name or if the
          name is greater than 8 characters long.
        */

        if (len < 9)  /* this is possibly a normal FITS keyword name */
        {
          ffupch(card);
          tstatus = 0;
          if (fftkey(card, &tstatus) > 0)
          {
             /* name contained non-standard characters, so reset */
             card[0] = '\0';
             strncat(card, tok, len);
          }
        }

        tok += len;

	/* Check optional "+" indicator to delete multiple keywords */
	if (tok[0] == '+' && len < FLEN_KEYWORD) {
	  strcat(card, "+");
	  return (*status);
	}

        /* second token, if present, is the new name for the keyword */

        len = strspn(tok, " ");  /* no. of spaces before next token */
        tok += len;

        if (tok[0] == '\0' || tok[0] == '=')
            return(*status);  /* no second token */

        *hdtype = -2;
        len = strcspn(tok, " ");  /* length of new name */
        /* this name has to fit on columns 41-80 of card,
           and first name must now fit in 1-40 */
        if (lentok1 > 40)
        {
           card[0] = '\0';
           return (*status = BAD_KEYCHAR);
        }
        if (len > 40)
        {
           card[0] = '\0'; 
           return(*status = BAD_KEYCHAR);
        }

        /* copy the new name to card + 40;  This is awkward, */
        /* but is consistent with the way the Fortran FITSIO works */
	strcat(card,"                                        ");
        strncpy(&card[40], tok, len);
        card[80] = '\0'; /* necessary to add terminator in case len = 40 */

        /*
            The HIERARCH convention supports non-standard characters
            in the keyword name, so don't always convert to upper case or
            abort if there are illegal characters in the name or if the
            name is greater than 8 characters long.
        */

        if (len < 9)  /* this is possibly a normal FITS keyword name */
        {
            ffupch(&card[40]);
            tstatus = 0;
            if (fftkey(&card[40], &tstatus) > 0)
            {
               /* name contained non-standard characters, so reset */
               strncpy(&card[40], tok, len);
            }
        }
    }
    else  /* no negative sign at beginning of template */
    {
      /* get the keyword name token */

      len = strcspn(tok, " =");  /* length of keyword name */
      if (len >= FLEN_KEYWORD)
        return(*status = BAD_KEYCHAR);

      strncat(keyname, tok, len);

      /*
        The HIERARCH convention supports non-standard characters
        in the keyword name, so don't always convert to upper case or
        abort if there are illegal characters in the name or if the
        name is greater than 8 characters long.
      */

      if (len < 9)  /* this is possibly a normal FITS keyword name */
      {
        ffupch(keyname);
        tstatus = 0;
        if (fftkey(keyname, &tstatus) > 0)
        {
           /* name contained non-standard characters, so reset */
           keyname[0] = '\0';
           strncat(keyname, tok, len);
        }
      }

      if (!FSTRCMP(keyname, "END") )
      {
         strcpy(card, "END");
         *hdtype = 2;
         return(*status);
      }

      tok += len; /* move token pointer to end of the keyword */

      if (!FSTRCMP(keyname, "COMMENT") || !FSTRCMP(keyname, "HISTORY")
         || !FSTRCMP(keyname, "HIERARCH") )
      {
        *hdtype = 1;   /* simply append COMMENT and HISTORY keywords */
        strcpy(card, keyname);
        strncat(card, tok, 72);
        return(*status);
      }

      /* look for the value token */
      len = strspn(tok, " =");  /* spaces or = between name and value */
      tok += len;

      if (*tok == '\'') /* is value enclosed in quotes? */
      {
          more = TRUE;
          remainlen = 139;
          while (more)
          {
            tok++;  /* temporarily move past the quote char */
            len = strcspn(tok, "'");  /* length of quoted string */
            tok--;
            if (len+2 > remainlen)
               return (*status=BAD_KEYCHAR);
            strncat(value, tok, len + 2);
            remainlen -= (len+2); 
 
            tok += len + 1;
            if (tok[0] != '\'')   /* check there is a closing quote */
              return(*status = NO_QUOTE);

            tok++;
            if (tok[0] != '\'')  /* 2 quote chars = literal quote */
              more = FALSE;
          }
      }
      else if (*tok == '/' || *tok == '\0')  /* There is no value */
      {
          strcat(value, " ");
      }
      else   /* not a quoted string value */
      {
          len = strcspn(tok, " /"); /* length of value string */
          if (len > 139)
             return (*status=BAD_KEYCHAR);
          strncat(value, tok, len);
          if (!( (tok[0] == 'T' || tok[0] == 'F') &&
                 (tok[1] == ' ' || tok[1] == '/' || tok[1] == '\0') )) 
          {
             /* not a logical value */

            dval = strtod(value, &suffix); /* try to read value as number */

            if (*suffix != '\0' && *suffix != ' ' && *suffix != '/')
            { 
                /* value not recognized as a number; might be because it */
                /* contains a 'd' or 'D' exponent character  */ 
                strcpy(tvalue, value);
                if ((loc = strchr(tvalue, 'D')))
                {          
                    *loc = 'E'; /*  replace D's with E's. */ 
                    dval = strtod(tvalue, &suffix); /* read value again */
                }
                else if ((loc = strchr(tvalue, 'd')))
                {
                    *loc = 'E'; /*  replace d's with E's. */ 
                    dval = strtod(tvalue, &suffix); /* read value again */
                }
                else if ((loc = strchr(tvalue, '.')))
                {
                    *loc = ','; /*  replace period with a comma */ 
                    dval = strtod(tvalue, &suffix); /* read value again */
                }
            }
   
            if (*suffix != '\0' && *suffix != ' ' && *suffix != '/')
            { 
              /* value is not a number; must enclose it in quotes */
              if (len > 137)
                return (*status=BAD_KEYCHAR);              
              strcpy(value, "'");
              strncat(value, tok, len);
              strcat(value, "'");

              /* the following useless statement stops the compiler warning */
              /* that dval is not used anywhere */
              if (dval == 0.)
                 len += (int) dval; 
            }
            else  
            {
                /* value is a number; convert any 'e' to 'E', or 'd' to 'D' */
                loc = strchr(value, 'e');
                if (loc)
                {          
                    *loc = 'E';  
                }
                else
                {
                    loc = strchr(value, 'd');
                    if (loc)
                    {          
                        *loc = 'D';  
                    }
                }
            }
          }
          tok += len;
      }

      len = strspn(tok, " /"); /* no. of spaces between value and comment */
      tok += len;

      vlen = strlen(value);
      if (vlen > 0 && vlen < 10 && value[0] == '\'')
      {
          /* pad quoted string with blanks so it is at least 8 chars long */
          value[vlen-1] = '\0';
          strncat(value, "        ", 10 - vlen);
          strcat(&value[9], "'");
      }

      /* get the comment string */
      strncat(comment, tok, 70);

      /* construct the complete FITS header card */
      ffmkky(keyname, value, comment, card, status);
    }
    return(*status);
}